

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

void __thiscall
HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_MetadataSerializationAndEndianness_Test
          (HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::~HashtableTest((HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, MetadataSerializationAndEndianness) {
  TypeParam ht_out;
  string kExpectedDense(
      "\x13W\x86"
      "B\0\0\0\0\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0",
      24);
  string kExpectedSparse("$hu1\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0", 20);

  if (ht_out.supports_readwrite()) {
    auto fp = tmpfile();
    EXPECT_TRUE(fp != NULL);

    EXPECT_TRUE(ht_out.write_metadata(fp));
    EXPECT_TRUE(ht_out.write_nopointer_data(fp));

    const size_t num_bytes = ftell(fp);
    rewind(fp);
    EXPECT_LE(num_bytes, static_cast<size_t>(24));
    char contents[24];
    EXPECT_EQ(num_bytes, fread(contents, 1, num_bytes, fp));
    EXPECT_EQ(EOF, fgetc(fp));  // check we're *exactly* the right size
    fclose(fp);
    // TODO(csilvers): check type of ht_out instead of looking at the 1st byte.
    if (contents[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, string(contents, num_bytes));
    } else {
      EXPECT_EQ(kExpectedSparse, string(contents, num_bytes));
    }
  }

  // Do it again with new-style serialization.  Here we can use StringIO.
  if (ht_out.supports_serialization()) {
    string stringbuf;
    StringIO stringio(&stringbuf);
    EXPECT_TRUE(
        ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));
    if (stringbuf[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, stringbuf);
    } else {
      EXPECT_EQ(kExpectedSparse, stringbuf);
    }
  }
}